

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

void __thiscall
duckdb::TemporaryFileManager::EraseUsedBlock
          (TemporaryFileManager *this,TemporaryFileManagerLock *lock,block_id_t id,
          TemporaryFileHandle *handle,TemporaryFileIndex index)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  idx_t val;
  TemporaryFileManagerLock *block_index;
  InternalException *this_00;
  ulong uVar4;
  _Node_iterator_base<std::pair<const_long,_duckdb::TemporaryFileIndex>,_false> __it;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  string local_40;
  
  uVar1 = (this->used_blocks)._M_h._M_bucket_count;
  uVar4 = (ulong)id % uVar1;
  p_Var5 = (this->used_blocks)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, p_Var5->_M_nxt[1]._M_nxt != (_Hash_node_base *)id))
  {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, p_Var2[1]._M_nxt == (_Hash_node_base *)id)) goto LAB_01147613;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_01147613:
  if (p_Var6 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var6->_M_nxt;
  }
  if (__it._M_cur == (__node_type *)0x0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"EraseUsedBlock - Block %llu not found in used blocks","");
    InternalException::InternalException<long>(this_00,&local_40,id);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::
  _Hashtable<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->used_blocks)._M_h,(const_iterator)__it._M_cur);
  val = optional_idx::GetIndex(&index.block_index);
  block_index = (TemporaryFileManagerLock *)
                NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
  TemporaryFileHandle::EraseBlockIndex(handle,(block_id_t)block_index);
  bVar3 = TemporaryFileHandle::DeleteIfEmpty(handle);
  if (bVar3) {
    EraseFileHandle(this,block_index,&index.identifier);
  }
  return;
}

Assistant:

void TemporaryFileManager::EraseUsedBlock(TemporaryFileManagerLock &lock, block_id_t id, TemporaryFileHandle &handle,
                                          TemporaryFileIndex index) {
	auto entry = used_blocks.find(id);
	if (entry == used_blocks.end()) {
		throw InternalException("EraseUsedBlock - Block %llu not found in used blocks", id);
	}
	used_blocks.erase(entry);
	handle.EraseBlockIndex(NumericCast<block_id_t>(index.block_index.GetIndex()));
	if (handle.DeleteIfEmpty()) {
		EraseFileHandle(lock, index.identifier);
	}
}